

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O2

Reals __thiscall
Omega_h::get_recip_length_weights
          (Omega_h *this,Mesh *mesh,Adj *surf_verts2edges,LOs *edge2surf_edge)

{
  uint size_in;
  void *extraout_RDX;
  ulong uVar1;
  double dVar2;
  Reals RVar3;
  Reals edge2weight;
  Write<signed_char> local_110;
  Write<signed_char> local_100;
  Write<double> edge2weight_w;
  Write<double> local_e0;
  Write<int> local_d0;
  Write<double> local_c0;
  Write<double> local_b0;
  Reals edge2len;
  Write<int> local_90;
  Write<double> local_80;
  Write<double> local_70;
  type f;
  
  measure_edges_real((Omega_h *)&edge2len,mesh);
  size_in = Mesh::nedges(mesh);
  std::__cxx11::string::string((string *)&edge2weight,"",(allocator *)&local_90);
  Write<double>::Write(&edge2weight_w,size_in,(string *)&edge2weight);
  std::__cxx11::string::~string((string *)&edge2weight);
  Write<int>::Write((Write<int> *)&f,&edge2surf_edge->write_);
  Write<double>::Write(&f.edge2weight_w,&edge2weight_w);
  Write<double>::Write(&f.edge2len.write_,&edge2len.write_);
  Write<int>::Write(&local_90,(Write<int> *)&f);
  Write<double>::Write(&local_80,&f.edge2weight_w);
  Write<double>::Write(&local_70,&f.edge2len.write_);
  if (0 < (int)size_in) {
    entering_parallel = 1;
    Write<int>::Write((Write<int> *)&edge2weight,&local_90);
    Write<double>::Write(&local_110,(Write<signed_char> *)&local_80);
    Write<double>::Write(&local_100,(Write<signed_char> *)&local_70);
    entering_parallel = 0;
    for (uVar1 = 0; size_in != uVar1; uVar1 = uVar1 + 1) {
      if (*(int *)((long)edge2weight.write_.shared_alloc_.direct_ptr + uVar1 * 4) == -1) {
        dVar2 = 0.0;
      }
      else {
        dVar2 = 1.0 / *(double *)((long)local_100.shared_alloc_.direct_ptr + uVar1 * 8);
      }
      *(double *)((long)local_110.shared_alloc_.direct_ptr + uVar1 * 8) = dVar2;
    }
    get_recip_length_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
              ((__0 *)&edge2weight);
  }
  get_recip_length_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
            ((__0 *)&local_90);
  Write<double>::Write(&local_b0,&edge2weight_w);
  Read<double>::Read((Read<signed_char> *)&edge2weight,&local_b0);
  Write<double>::~Write(&local_b0);
  Write<int>::Write(&local_d0,&(surf_verts2edges->super_Graph).ab2b.write_);
  Write<double>::Write(&local_e0,&edge2weight.write_);
  unmap<double>((Omega_h *)&local_c0,(LOs *)&local_d0,(Read<signed_char> *)&local_e0,1);
  Read<double>::Read((Read<signed_char> *)this,&local_c0);
  Write<double>::~Write(&local_c0);
  Write<double>::~Write(&local_e0);
  Write<int>::~Write(&local_d0);
  Write<double>::~Write(&edge2weight.write_);
  get_recip_length_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0((__0 *)&f);
  Write<double>::~Write(&edge2weight_w);
  Write<double>::~Write(&edge2len.write_);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals get_recip_length_weights(
    Mesh* mesh, Adj surf_verts2edges, LOs edge2surf_edge) {
  auto edge2len = measure_edges_real(mesh);
  auto nedges = mesh->nedges();
  auto edge2weight_w = Write<Real>(nedges);
  auto f = OMEGA_H_LAMBDA(LO edge) {
    if (edge2surf_edge[edge] == -1)
      edge2weight_w[edge] = 0.0;
    else
      edge2weight_w[edge] = 1.0 / edge2len[edge];
  };
  parallel_for(nedges, f, "get_recip_length_weights");
  auto edge2weight = Reals(edge2weight_w);
  return unmap(surf_verts2edges.ab2b, edge2weight, 1);
}